

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O2

void Am_Gesture_Start_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int x;
  int y;
  bool bVar1;
  ostream *poVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value;
  Am_Object command_obj;
  Am_Input_Char ic;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Point_List local_58;
  Am_Inter_Internal_Method inter_method;
  
  Am_Object::Am_Object(&local_60,inter);
  bVar1 = Am_Inter_Tracing(&local_60);
  Am_Object::~Am_Object(&local_60);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Gesture starting over ");
    poVar2 = operator<<(poVar2,object);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  inter_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  inter_method.Call = (Am_Inter_Internal_Method_Type *)0x0;
  pAVar3 = Am_Object::Get(&Am_Interactor,0xbe,0);
  Am_Inter_Internal_Method::operator=(&inter_method,pAVar3);
  (*inter_method.Call)(inter,object,event_window,ev);
  command_obj.data = (Am_Object_Data *)0x0;
  x = ev->x;
  y = ev->y;
  ic = ev->input_char;
  pAVar3 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&command_obj,pAVar3);
  Am_Inter_Call_Both_Method(inter,&command_obj,199,x,y,event_window,&ic,object,&Am_No_Location);
  Am_Object::Am_Object(&local_68,inter);
  Am_Point_List::Am_Point_List(&local_58);
  value = Am_Point_List::operator_cast_to_Am_Wrapper_(&local_58);
  Am_Object::Set(&local_68,0xb2,value,0);
  Am_Point_List::~Am_Point_List(&local_58);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Am_Object(&local_70,inter);
  Am_Object::Am_Object(&local_78,&command_obj);
  Am_Object::Am_Object(&local_80,event_window);
  gesture_new_point(&local_70,&local_78,x,y,&local_80,ic);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&command_obj);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Gesture_Start_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  if (Am_Inter_Tracing(inter))
    std::cout << "Gesture starting over " << object << std::endl;
  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_START_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  int x = ev->x;
  int y = ev->y;
  Am_Input_Char ic = ev->input_char;
  command_obj = inter.Get(Am_COMMAND);

  Am_Inter_Call_Both_Method(inter, command_obj, Am_START_DO_METHOD, x, y,
                            event_window, ic, object, Am_No_Location);

  gesture_start(inter);
  gesture_new_point(inter, command_obj, x, y, event_window, ic);
}